

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall
customUnits_uniquenesspermeter3_Test::TestBody(customUnits_uniquenesspermeter3_Test *this)

{
  bool bVar1;
  char *pcVar2;
  Message *pMVar3;
  char *in_R9;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double in_XMM1_Qa;
  string local_2c0;
  AssertHelper local_2a0;
  Message local_298;
  precise_unit local_290;
  precise_unit local_280;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_238;
  Message local_230;
  bool local_221;
  undefined1 local_220 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1f0;
  Message local_1e8;
  bool local_1d9;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_1a8;
  Message local_1a0;
  bool local_191;
  undefined1 local_190 [8];
  AssertionResult gtest_ar__2;
  undefined1 local_170 [8];
  precise_unit cunit2adj;
  precise_unit cunit2;
  undefined1 local_148 [6];
  uint16_t jj;
  AssertHelper local_128;
  Message local_120;
  unit_data local_118;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_e0;
  Message local_d8;
  unit_data local_d0;
  bool local_c9;
  undefined1 local_c8 [8];
  AssertionResult gtest_ar_;
  Message local_b0;
  precise_unit local_a8;
  unit_data local_98;
  int local_94;
  undefined1 local_90 [8];
  AssertionResult gtest_ar_1;
  Message local_78 [3];
  unit_data local_60;
  int local_5c;
  undefined1 local_58 [8];
  AssertionResult gtest_ar;
  undefined1 local_38 [8];
  precise_unit cunit1adj;
  precise_unit cunit1;
  uint16_t ii;
  customUnits_uniquenesspermeter3_Test *this_local;
  
  for (cunit1.commodity_._2_2_ = 0; cunit1.commodity_._2_2_ < 0x400;
      cunit1.commodity_._2_2_ = cunit1.commodity_._2_2_ + 1) {
    join_0x00000000_0x00001200_ = units::precise::generate_custom_unit(cunit1.commodity_._2_2_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )units::precise_unit::pow
                     ((precise_unit *)units::precise::meter,cunit1adj._8_8_,in_XMM1_Qa);
    _local_38 = units::precise_unit::operator/
                          ((precise_unit *)&cunit1adj.base_units_,(precise_unit *)&gtest_ar.message_
                          );
    local_60 = units::precise_unit::base_units((precise_unit *)local_38);
    local_5c = units::precise::custom::custom_unit_number(&local_60);
    testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
              ((EqHelper *)local_58,"precise::custom::custom_unit_number(cunit1adj.base_units())",
               "ii",&local_5c,(unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
    if (!bVar1) {
      testing::Message::Message(local_78);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_58);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,1000,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_78);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_78);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_58);
    local_a8 = units::precise_unit::inv((precise_unit *)local_38);
    local_98 = units::precise_unit::base_units(&local_a8);
    local_94 = units::precise::custom::custom_unit_number(&local_98);
    testing::internal::EqHelper::Compare<int,_unsigned_short,_nullptr>
              ((EqHelper *)local_90,
               "precise::custom::custom_unit_number(cunit1adj.inv().base_units())","ii",&local_94,
               (unsigned_short *)((long)&cunit1.commodity_ + 2));
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_90);
    if (!bVar1) {
      testing::Message::Message(&local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_90);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3eb,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
      testing::Message::~Message(&local_b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_90);
    local_d0 = units::precise_unit::base_units((precise_unit *)&cunit1adj.base_units_);
    local_c9 = units::precise::custom::is_custom_unit(&local_d0);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_c8,&local_c9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c8);
    if (!bVar1) {
      testing::Message::Message(&local_d8);
      pMVar3 = testing::Message::operator<<
                         (&local_d8,(char (*) [41])"Error with custom unit/meter3 detection ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__1.message_,(internal *)local_c8,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1.base_units())","false",
                 "true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3ec,pcVar2);
      testing::internal::AssertHelper::operator=(&local_e0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_e0);
      std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_d8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c8);
    local_118 = units::precise_unit::base_units((precise_unit *)local_38);
    local_111 = units::precise::custom::is_custom_unit(&local_118);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_110,&local_111,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pMVar3 = testing::Message::operator<<
                         (&local_120,
                          (char (*) [52])"Error with custom unit/meter3 detection of inverse ");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)local_148,(internal *)local_110,
                 (AssertionResult *)"precise::custom::is_custom_unit(cunit1adj.base_units())",
                 "false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_128,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x3ee,pcVar2);
      testing::internal::AssertHelper::operator=(&local_128,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_128);
      std::__cxx11::string::~string((string *)local_148);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
    __x = extraout_XMM0_Qa;
    for (cunit2.commodity_._2_2_ = 0; cunit2.commodity_._2_2_ < 0x400;
        cunit2.commodity_._2_2_ = cunit2.commodity_._2_2_ + 1) {
      if (cunit1.commodity_._2_2_ != cunit2.commodity_._2_2_) {
        join_0x00000000_0x00001200_ = units::precise::generate_custom_unit(cunit2.commodity_._2_2_);
        gtest_ar__2.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
              )units::precise_unit::pow
                         ((precise_unit *)units::precise::m,cunit2adj._8_8_,in_XMM1_Qa);
        _local_170 = units::precise_unit::operator/
                               ((precise_unit *)&cunit2adj.base_units_,
                                (precise_unit *)&gtest_ar__2.message_);
        local_191 = units::precise_unit::operator==
                              ((precise_unit *)&cunit1adj.base_units_,(precise_unit *)local_170);
        local_191 = !local_191;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_190,&local_191,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_190);
        if (!bVar1) {
          testing::Message::Message(&local_1a0);
          pMVar3 = testing::Message::operator<<
                             (&local_1a0,
                              (char (*) [52])"Error with false per meter3 comparison 1 inv index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__3.message_,(internal *)local_190,
                     (AssertionResult *)"cunit1 == cunit2adj","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1a8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3f6,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1a8,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_1a8);
          std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
          testing::Message::~Message(&local_1a0);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_190);
        local_1d9 = units::precise_unit::operator==
                              ((precise_unit *)local_38,(precise_unit *)&cunit2adj.base_units_);
        local_1d9 = !local_1d9;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_1d8,&local_1d9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
        if (!bVar1) {
          testing::Message::Message(&local_1e8);
          pMVar3 = testing::Message::operator<<
                             (&local_1e8,
                              (char (*) [48])"Error with false per meter3 comparison 2 index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_1d8,
                     (AssertionResult *)"cunit1adj == cunit2","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_1f0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3f9,pcVar2);
          testing::internal::AssertHelper::operator=(&local_1f0,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_1f0);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_1e8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
        local_221 = units::precise_unit::operator==
                              ((precise_unit *)local_38,(precise_unit *)local_170);
        local_221 = !local_221;
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_220,&local_221,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
        if (!bVar1) {
          testing::Message::Message(&local_230);
          pMVar3 = testing::Message::operator<<
                             (&local_230,
                              (char (*) [59])
                              "Error with false per meter3 comparison 2 per meter3 index ");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2));
          pMVar3 = testing::Message::operator<<(pMVar3,(char (*) [2])",");
          pMVar3 = testing::Message::operator<<
                             (pMVar3,(unsigned_short *)((long)&cunit2.commodity_ + 2));
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__5.message_,(internal *)local_220,
                     (AssertionResult *)"cunit1adj == cunit2adj","true","false",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_238,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                     ,0x3fc,pcVar2);
          testing::internal::AssertHelper::operator=(&local_238,pMVar3);
          testing::internal::AssertHelper::~AssertHelper(&local_238);
          std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
          testing::Message::~Message(&local_230);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
        __x = extraout_XMM0_Qa_00;
      }
    }
    local_290.multiplier_ =
         units::precise_unit::pow((precise_unit *)units::precise::m,__x,in_XMM1_Qa);
    local_280 = units::precise_unit::operator*((precise_unit *)local_38,&local_290);
    local_269 = units::precise_unit::operator==(&local_280,(precise_unit *)&cunit1adj.base_units_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_268,&local_269,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
    if (!bVar1) {
      testing::Message::Message(&local_298);
      pMVar3 = testing::Message::operator<<
                         (&local_298,(char (*) [36])"Error with true per meter3 multiply");
      pMVar3 = testing::Message::operator<<(pMVar3,(unsigned_short *)((long)&cunit1.commodity_ + 2))
      ;
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2c0,(internal *)local_268,
                 (AssertionResult *)"cunit1adj * precise::m.pow(3) == cunit1","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_ops.cpp"
                 ,0x400,pcVar2);
      testing::internal::AssertHelper::operator=(&local_2a0,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_2a0);
      std::__cxx11::string::~string((string *)&local_2c0);
      testing::Message::~Message(&local_298);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  }
  return;
}

Assistant:

TEST(customUnits, uniquenesspermeter3)
{
    for (std::uint16_t ii = 0; ii < 1024; ++ii) {
        auto cunit1 = precise::generate_custom_unit(ii);
        auto cunit1adj = cunit1 / precise::meter.pow(3);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.base_units()), ii);
        EXPECT_EQ(
            precise::custom::custom_unit_number(cunit1adj.inv().base_units()),
            ii);
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1.base_units()))
            << "Error with custom unit/meter3 detection " << ii;
        EXPECT_TRUE(precise::custom::is_custom_unit(cunit1adj.base_units()))
            << "Error with custom unit/meter3 detection of inverse " << ii;
        for (std::uint16_t jj = 0; jj < 1024; ++jj) {
            if (ii == jj) {
                continue;
            }
            auto cunit2 = precise::generate_custom_unit(jj);
            auto cunit2adj = cunit2 / precise::m.pow(3);
            EXPECT_FALSE(cunit1 == cunit2adj)
                << "Error with false per meter3 comparison 1 inv index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2)
                << "Error with false per meter3 comparison 2 index " << ii
                << "," << jj;
            EXPECT_FALSE(cunit1adj == cunit2adj)
                << "Error with false per meter3 comparison 2 per meter3 index "
                << ii << "," << jj;
        }
        EXPECT_TRUE(cunit1adj * precise::m.pow(3) == cunit1)
            << "Error with true per meter3 multiply" << ii;
    }
}